

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

qsizetype cost(QPixmap *pixmap)

{
  long lVar1;
  int iVar2;
  QPixmap *this;
  longlong *plVar3;
  long in_FS_OFFSET;
  qint64 costMax;
  qint64 costKb;
  QPixmap *in_stack_ffffffffffffffc0;
  longlong *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QPixmap::width(in_stack_ffffffffffffffc0);
  this = (QPixmap *)(long)iVar2;
  iVar2 = QPixmap::height(this);
  plVar3 = (longlong *)((long)this * (long)iVar2);
  QPixmap::depth(this);
  plVar3 = qBound<long_long>(in_stack_ffffffffffffffd0,plVar3,(longlong *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *plVar3;
  }
  __stack_chk_fail();
}

Assistant:

static inline qsizetype cost(const QPixmap &pixmap)
{
    // make sure to do a 64bit calculation; qsizetype might be smaller
    const qint64 costKb = static_cast<qint64>(pixmap.width())
                        * pixmap.height() * pixmap.depth() / (8 * 1024);
    const qint64 costMax = std::numeric_limits<qsizetype>::max();
    // a small pixmap should have at least a cost of 1(kb)
    return static_cast<qsizetype>(qBound(1LL, costKb, costMax));
}